

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gme.cpp
# Opt level: O1

gme_type_t gme_identify_extension(char *extension_)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  gme_type_t pgVar4;
  char *pcVar5;
  gme_type_t *ppgVar6;
  char extension [6];
  char local_1e;
  char acStack_1d [5];
  
  pcVar2 = strrchr(extension_,0x2e);
  pcVar5 = pcVar2 + 1;
  if (pcVar2 == (char *)0x0) {
    pcVar5 = extension_;
  }
  iVar1 = toupper((int)*pcVar5);
  local_1e = (char)iVar1;
  if (local_1e != '\0') {
    uVar3 = 0xffffffffffffffff;
    do {
      if (uVar3 == 4) goto LAB_005787eb;
      iVar1 = toupper((int)pcVar5[uVar3 + 2]);
      acStack_1d[uVar3 + 1] = (char)iVar1;
      uVar3 = uVar3 + 1;
    } while ((char)iVar1 != '\0');
    if (4 < uVar3) {
LAB_005787eb:
      local_1e = '\0';
    }
  }
  gme_type_list();
  pgVar4 = gme_type_list::gme_type_list_[0];
  if (gme_type_list::gme_type_list_[0] != (gme_type_t)0x0) {
    ppgVar6 = gme_type_list::gme_type_list_;
    do {
      ppgVar6 = ppgVar6 + 1;
      iVar1 = strcmp(&local_1e,pgVar4->extension_);
      if (iVar1 == 0) {
        return pgVar4;
      }
      pgVar4 = *ppgVar6;
    } while (pgVar4 != (gme_type_t)0x0);
  }
  return pgVar4;
}

Assistant:

BLARGG_EXPORT gme_type_t gme_identify_extension( const char* extension_ )
{
	char const* end = strrchr( extension_, '.' );
	if ( end )
		extension_ = end + 1;
	
	char extension [6];
	to_uppercase( extension_, sizeof extension, extension );
	
	for ( gme_type_t const* types = gme_type_list(); *types; types++ )
		if ( !strcmp( extension, (*types)->extension_ ) )
			return *types;
	return 0;
}